

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall camp::NullObject::NullObject(NullObject *this,Class *objectClass)

{
  string *psVar1;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  Class *local_18;
  Class *objectClass_local;
  NullObject *this_local;
  
  local_18 = objectClass;
  objectClass_local = (Class *)this;
  if (objectClass == (Class *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"unknown",&local_59);
  }
  else {
    psVar1 = Class::name_abi_cxx11_(objectClass);
    std::__cxx11::string::string(local_58,(string *)psVar1);
  }
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "trying to use a null metaobject of class ");
  Error::Error(&this->super_Error,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  if (objectClass == (Class *)0x0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  *(undefined ***)&this->super_Error = &PTR__NullObject_001fd060;
  return;
}

Assistant:

NullObject::NullObject(const Class* objectClass)
    : Error("trying to use a null metaobject of class " + (objectClass ? objectClass->name() : "unknown"))
{
}